

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::GenerateDoneFile(cmCTest *this)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  bool bVar2;
  ostream *poVar3;
  allocator<char> local_421;
  string local_420;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_400;
  cmXMLWriter xml;
  cmGeneratedFileStream ofs;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xml,"Done.xml",(allocator<char> *)&local_420);
  bVar2 = OpenOutputFile(this,&(_Var1._M_head_impl)->CurrentTag,(string *)&xml,&ofs,false);
  std::__cxx11::string::~string((string *)&xml);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&xml);
    poVar3 = std::operator<<((ostream *)&xml,"Cannot open done file");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x651,local_420._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xml);
  }
  else {
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&ofs,0);
    cmXMLWriter::StartDocument(&xml,"UTF-8");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"Done",(allocator<char> *)&local_400);
    cmXMLWriter::StartElement(&xml,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"buildId",(allocator<char> *)&local_400);
    cmXMLWriter::Element<std::__cxx11::string>
              (&xml,&local_420,
               &((this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->BuildID);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"time",&local_421);
    local_400.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (&xml,&local_420,&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndDocument(&xml);
    cmXMLWriter::~cmXMLWriter(&xml);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  return (uint)!bVar2;
}

Assistant:

int cmCTest::GenerateDoneFile()
{
  cmGeneratedFileStream ofs;
  if (!this->OpenOutputFile(this->Impl->CurrentTag, "Done.xml", ofs)) {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open done file" << std::endl);
    return 1;
  }
  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.StartElement("Done");
  xml.Element("buildId", this->Impl->BuildID);
  xml.Element("time", std::chrono::system_clock::now());
  xml.EndElement(); // Done
  xml.EndDocument();

  return 0;
}